

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::ebml_read_element_level_up(MatroskaDemuxer *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int64_t *piVar5;
  
  iVar1 = this->num_levels;
  if ((long)iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    lVar2 = (this->super_IOContextDemuxer).m_processedBytes;
    piVar5 = &this->levels[(long)iVar1 + -1].length;
    iVar3 = 0;
    iVar4 = iVar1;
    while (iVar4 = iVar4 + -1, *piVar5 + ((MatroskaLevel *)(piVar5 + -1))->start <= lVar2) {
      this->num_levels = iVar4;
      iVar3 = iVar3 + 1;
      piVar5 = piVar5 + -2;
      if (iVar4 == 0) {
        return iVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int MatroskaDemuxer::ebml_read_element_level_up()
{
    // offset_t pos = url_ftell(pb);
    int num = 0;

    while (num_levels > 0)
    {
        const MatroskaLevel *level = &levels[num_levels - 1];

        if (m_processedBytes >= level->start + level->length)
        {
            num_levels--;
            num++;
        }
        else
        {
            break;
        }
    }

    return num;
}